

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int isSelectionEvent(Display *display,XEvent_conflict *event,XPointer pointer)

{
  bool local_29;
  XPointer pointer_local;
  XEvent_conflict *event_local;
  Display *display_local;
  
  if ((event->xany).window == _glfw.x11.helperWindowHandle) {
    local_29 = true;
    if ((event->type != 0x1e) && (local_29 = true, event->type != 0x1f)) {
      local_29 = event->type == 0x1d;
    }
    display_local._4_4_ = (uint)local_29;
  }
  else {
    display_local._4_4_ = 0;
  }
  return display_local._4_4_;
}

Assistant:

static Bool isSelectionEvent(Display* display, XEvent* event, XPointer pointer)
{
    if (event->xany.window != _glfw.x11.helperWindowHandle)
        return False;

    return event->type == SelectionRequest ||
           event->type == SelectionNotify ||
           event->type == SelectionClear;
}